

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O0

void wasm::FunctionValidator::scan(FunctionValidator *self,Expression **currp)

{
  Index *this;
  byte bVar1;
  bool bVar2;
  Try *pTVar3;
  size_t sVar4;
  Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_> *pWVar5;
  Call *pCVar6;
  CallIndirect *pCVar7;
  CallRef *pCVar8;
  Expression **ppEVar9;
  Iterator IVar10;
  BasicType local_ec;
  Expression *local_e8;
  Expression *child;
  Self *local_d8;
  Index local_d0;
  undefined1 local_c8 [8];
  Iterator __end3;
  undefined1 local_98 [8];
  Iterator __begin3;
  ChildIterator *__range3;
  bool hasUnreachableChild;
  Function *pFStack_38;
  Function *func;
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *pAStack_28;
  int i;
  ExpressionList *list;
  Expression *curr;
  Expression **currp_local;
  FunctionValidator *self_local;
  
  list = (ExpressionList *)*currp;
  curr = (Expression *)currp;
  currp_local = (Expression **)self;
  bVar2 = Expression::is<wasm::Try>((Expression *)list);
  if (bVar2) {
    Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::pushTask
              ((Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_> *)
               (currp_local + 0xb),
               Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::
               doVisitTry,(Expression **)curr);
    pTVar3 = Expression::cast<wasm::Try>((Expression *)list);
    pAStack_28 = &(pTVar3->catchBodies).
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>;
    sVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size(pAStack_28);
    func._4_4_ = (int)sVar4;
    while (func._4_4_ = func._4_4_ + -1, -1 < func._4_4_) {
      pWVar5 = (Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_> *)
               (currp_local + 0xb);
      ppEVar9 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (pAStack_28,(long)func._4_4_);
      Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::pushTask
                (pWVar5,scan,ppEVar9);
    }
    Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::pushTask
              ((Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_> *)
               (currp_local + 0xb),visitPreCatch,(Expression **)curr);
    pWVar5 = (Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_> *)
             (currp_local + 0xb);
    pTVar3 = Expression::cast<wasm::Try>((Expression *)list);
    Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::pushTask
              (pWVar5,scan,&pTVar3->body);
    Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::pushTask
              ((Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_> *)
               (currp_local + 0xb),visitPreTry,(Expression **)curr);
    return;
  }
  PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::scan
            ((FunctionValidator *)currp_local,(Expression **)curr);
  bVar2 = Expression::is<wasm::Block>((Expression *)list);
  if (bVar2) {
    Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::pushTask
              ((Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_> *)
               (currp_local + 0xb),visitPreBlock,(Expression **)curr);
  }
  bVar2 = Expression::is<wasm::Loop>((Expression *)list);
  if (bVar2) {
    Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::pushTask
              ((Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_> *)
               (currp_local + 0xb),visitPreLoop,(Expression **)curr);
  }
  pFStack_38 = Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::
               getFunction((Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                            *)(currp_local + 0xb));
  if ((pFStack_38 != (Function *)0x0) && (pFStack_38->profile == Poppy)) {
    Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::pushTask
              ((Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_> *)
               (currp_local + 0xb),visitPoppyExpression,(Expression **)curr);
  }
  __range3._4_4_ = 1;
  bVar2 = wasm::Type::operator==
                    ((Type *)&(list->
                              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                              ).usedElements,(BasicType *)((long)&__range3 + 4));
  if (!bVar2) {
    return;
  }
  switch(*(undefined1 *)
          &(list->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).data)
  {
  case 4:
    return;
  case 5:
  case 0x13:
  case 0x17:
  case 0x36:
  case 0x37:
  case 0x38:
    return;
  case 6:
    pCVar6 = Expression::cast<wasm::Call>((Expression *)list);
    bVar1 = pCVar6->isReturn;
    break;
  case 7:
    pCVar7 = Expression::cast<wasm::CallIndirect>((Expression *)list);
    bVar1 = pCVar7->isReturn;
    break;
  default:
    goto LAB_026b55e7;
  case 0x3d:
    pCVar8 = Expression::cast<wasm::CallRef>((Expression *)list);
    bVar1 = pCVar8->isReturn;
  }
  if ((bVar1 & 1) == 0) {
LAB_026b55e7:
    __range3._3_1_ = 0;
    this = &__begin3.index;
    ChildIterator::ChildIterator((ChildIterator *)this,(Expression *)list);
    IVar10 = AbstractChildIterator<wasm::ChildIterator>::begin
                       ((AbstractChildIterator<wasm::ChildIterator> *)this);
    __end3._8_8_ = IVar10.parent;
    __begin3.parent._0_4_ = IVar10.index;
    local_98 = (undefined1  [8])__end3._8_8_;
    IVar10 = AbstractChildIterator<wasm::ChildIterator>::end
                       ((AbstractChildIterator<wasm::ChildIterator> *)this);
    local_d8 = IVar10.parent;
    local_d0 = IVar10.index;
    local_c8 = (undefined1  [8])local_d8;
    __end3.parent._0_4_ = local_d0;
    while (bVar2 = AbstractChildIterator<wasm::ChildIterator>::Iterator::operator!=
                             ((Iterator *)local_98,(Iterator *)local_c8), bVar2) {
      ppEVar9 = AbstractChildIterator<wasm::ChildIterator>::Iterator::operator*
                          ((Iterator *)local_98);
      local_e8 = *ppEVar9;
      local_ec = unreachable;
      bVar2 = wasm::Type::operator==(&local_e8->type,&local_ec);
      if (bVar2) {
        __range3._3_1_ = 1;
        break;
      }
      AbstractChildIterator<wasm::ChildIterator>::Iterator::operator++((Iterator *)local_98);
    }
    child._4_4_ = 6;
    ChildIterator::~ChildIterator((ChildIterator *)&__begin3.index);
    shouldBeTrue<wasm::Expression*>
              ((FunctionValidator *)currp_local,(bool)(__range3._3_1_ & 1),(Expression *)list,
               "unreachable instruction must have unreachable child");
  }
  return;
}

Assistant:

static void scan(FunctionValidator* self, Expression** currp) {
    auto* curr = *currp;
    // Treat 'Try' specially because we need to run visitPreCatch between the
    // try body and catch bodies
    if (curr->is<Try>()) {
      self->pushTask(doVisitTry, currp);
      auto& list = curr->cast<Try>()->catchBodies;
      for (int i = int(list.size()) - 1; i >= 0; i--) {
        self->pushTask(scan, &list[i]);
      }
      self->pushTask(visitPreCatch, currp);
      self->pushTask(scan, &curr->cast<Try>()->body);
      self->pushTask(visitPreTry, currp);
      return;
    }

    PostWalker<FunctionValidator>::scan(self, currp);

    if (curr->is<Block>()) {
      self->pushTask(visitPreBlock, currp);
    }
    if (curr->is<Loop>()) {
      self->pushTask(visitPreLoop, currp);
    }
    if (auto* func = self->getFunction()) {
      if (func->profile == IRProfile::Poppy) {
        self->pushTask(visitPoppyExpression, currp);
      }
    }

    // Also verify that only allowed expressions end up in the situation where
    // the expression has type unreachable but there is no unreachable child.
    // For example a Call with no unreachable child cannot be unreachable, but a
    // Break can be.
    if (curr->type == Type::unreachable) {
      switch (curr->_id) {
        case Expression::BreakId: {
          // If there is a condition, that is already validated fully in
          // visitBreak(). If there isn't a condition, then this is allowed to
          // be unreachable even without an unreachable child. Either way, we
          // can leave.
          return;
        }
        case Expression::SwitchId:
        case Expression::ReturnId:
        case Expression::UnreachableId:
        case Expression::ThrowId:
        case Expression::RethrowId:
        case Expression::ThrowRefId: {
          // These can all be unreachable without an unreachable child.
          return;
        }
        case Expression::CallId: {
          if (curr->cast<Call>()->isReturn) {
            return;
          }
          break;
        }
        case Expression::CallIndirectId: {
          if (curr->cast<CallIndirect>()->isReturn) {
            return;
          }
          break;
        }
        case Expression::CallRefId: {
          if (curr->cast<CallRef>()->isReturn) {
            return;
          }
          break;
        }
        default: {
          break;
        }
      }

      // If we reach here, then we must have an unreachable child.
      bool hasUnreachableChild = false;
      for (auto* child : ChildIterator(curr)) {
        if (child->type == Type::unreachable) {
          hasUnreachableChild = true;
          break;
        }
      }
      self->shouldBeTrue(hasUnreachableChild,
                         curr,
                         "unreachable instruction must have unreachable child");
    }
  }